

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O2

array<unsigned___int128,_4UL> *
kmer_fw_neighbours128
          (array<unsigned___int128,_4UL> *__return_storage_ptr__,__uint128_t kmer,uint8_t k)

{
  char in_CL;
  ulong uVar1;
  long in_RDX;
  uint7 in_register_00000031;
  ulong uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  
  auVar4 = __ashlti3(0xffffffffffffffff,0xffffffffffffffff,in_CL * '\x02');
  uVar1 = 0;
  for (uVar2 = 0; uVar2 < (uVar1 < 4); uVar2 = uVar2 + bVar3) {
    *(ulong *)(__return_storage_ptr__->_M_elems + uVar1) =
         (uVar1 | CONCAT71(in_register_00000031,k) << 2) & ~auVar4._0_8_;
    *(ulong *)((long)__return_storage_ptr__->_M_elems + uVar1 * 0x10 + 8) =
         (uVar2 | in_RDX << 2 | (ulong)(in_register_00000031 >> 0x36)) & ~auVar4._8_8_;
    bVar3 = 0xfffffffffffffffe < uVar1;
    uVar1 = uVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<__uint128_t,4> kmer_fw_neighbours128(__uint128_t kmer, uint8_t k) {
    std::array<__uint128_t,4> n;
    for (__uint128_t i=0;i<4;++i){
        n[i]=((kmer<<2)+i)%(((__uint128_t) 1)<<(k*2));
    }
    return n;
}